

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_dr_wav_f32_to_s16(ma_int16 *pOut,float *pIn,size_t sampleCount)

{
  float fVar1;
  size_t sVar2;
  ushort uVar3;
  float fVar4;
  
  for (sVar2 = 0; sampleCount != sVar2; sVar2 = sVar2 + 1) {
    fVar1 = pIn[sVar2];
    uVar3 = 0x8000;
    if (-1.0 <= fVar1) {
      fVar4 = 1.0;
      if (fVar1 <= 1.0) {
        fVar4 = fVar1;
      }
      uVar3 = (ushort)(int)((fVar4 + 1.0) * 32767.5) ^ 0x8000;
    }
    pOut[sVar2] = uVar3;
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_f32_to_s16(ma_int16* pOut, const float* pIn, size_t sampleCount)
{
    int r;
    size_t i;
    for (i = 0; i < sampleCount; ++i) {
        float x = pIn[i];
        float c;
        c = ((x < -1) ? -1 : ((x > 1) ? 1 : x));
        c = c + 1;
        r = (int)(c * 32767.5f);
        r = r - 32768;
        pOut[i] = (short)r;
    }
}